

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O3

void u64From(u64 *dest,void *src,size_t count)

{
  memMove(dest,src,count);
  if ((count & 7) != 0) {
    memSet((void *)((long)dest + count),'\0',8 - (count & 7));
    return;
  }
  return;
}

Assistant:

void u64From(u64 dest[], const void* src, size_t count)
{
	ASSERT(memIsValid(src, count));
	ASSERT(memIsValid(dest, ((count + 7) / 8) * 8));
	memMove(dest, src, count);
	if (count % 8)
		memSetZero((octet*)dest + count, 8 - count % 8);
#if (OCTET_ORDER == BIG_ENDIAN)
	for (count = (count + 7) / 8; count--;)
		dest[count] = u64Rev(dest[count]);
#endif // OCTET_ORDER
}